

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_members.cpp
# Opt level: O0

DefParamSyntax * __thiscall slang::parsing::Parser::parseDefParam(Parser *this,AttrList attributes)

{
  span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL> elements;
  span<slang::syntax::TokenOrSyntax,_18446744073709551615UL> elements_00;
  Token defparam_00;
  Token semi_00;
  int iVar1;
  undefined4 extraout_var;
  DefParamSyntax *pDVar3;
  EVP_PKEY_CTX *src;
  undefined8 *in_RDI;
  SmallVector<slang::syntax::TokenOrSyntax,_8UL> buffer;
  Token semi;
  Token defparam;
  Token *in_stack_fffffffffffffdd0;
  SeparatedSyntaxList<slang::syntax::DefParamAssignmentSyntax> *this_00;
  undefined4 uVar4;
  undefined4 in_stack_fffffffffffffddc;
  __extent_storage<18446744073709551615UL> in_stack_fffffffffffffde0;
  ParserBase *in_stack_fffffffffffffdf0;
  Info *pIVar5;
  SyntaxKind in_stack_fffffffffffffee8;
  TokenKind in_stack_fffffffffffffef4;
  TokenKind in_stack_fffffffffffffef6;
  SmallVectorBase<slang::syntax::TokenOrSyntax> *in_stack_fffffffffffffef8;
  ParserBase *in_stack_ffffffffffffff00;
  DiagCode in_stack_ffffffffffffff10;
  anon_class_8_1_8991fb9c *in_stack_ffffffffffffff18;
  AllowEmpty in_stack_ffffffffffffff20;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *local_38;
  SyntaxFactory *pSStack_30;
  undefined8 uVar2;
  
  ParserBase::consume(in_stack_fffffffffffffdf0);
  Token::Token(in_stack_fffffffffffffdd0);
  SmallVector<slang::syntax::TokenOrSyntax,_8UL>::SmallVector
            ((SmallVector<slang::syntax::TokenOrSyntax,_8UL> *)0x8a9d05);
  this_00 = (SeparatedSyntaxList<slang::syntax::DefParamAssignmentSyntax> *)&stack0xfffffffffffffee0
  ;
  uVar4 = 0;
  ParserBase::
  parseList<&slang::syntax::SyntaxFacts::isPossibleExpressionOrComma,&slang::syntax::SyntaxFacts::isSemicolon,slang::parsing::Parser::parseDefParam(std::span<slang::syntax::AttributeInstanceSyntax*,18446744073709551615ul>)::__0>
            (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,in_stack_fffffffffffffef6,
             in_stack_fffffffffffffef4,(Token *)CONCAT44(0x590005,in_stack_fffffffffffffee8),
             (RequireItems)((ulong)in_RDI >> 0x20),in_stack_ffffffffffffff10,
             in_stack_ffffffffffffff18,in_stack_ffffffffffffff20);
  *(undefined1 *)(in_RDI + 0x39) = 1;
  pIVar5 = (Info *)(in_RDI + 0x1c);
  elements._M_ptr._4_4_ = in_stack_fffffffffffffddc;
  elements._M_ptr._0_4_ = uVar4;
  elements._M_extent._M_extent_value = in_stack_fffffffffffffde0._M_extent_value;
  slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>::SyntaxList
            ((SyntaxList<slang::syntax::AttributeInstanceSyntax> *)this_00,elements);
  iVar1 = SmallVectorBase<slang::syntax::TokenOrSyntax>::copy
                    ((SmallVectorBase<slang::syntax::TokenOrSyntax> *)&stack0xfffffffffffffef0,
                     (EVP_PKEY_CTX *)*in_RDI,src);
  uVar2 = CONCAT44(extraout_var,iVar1);
  elements_00._M_ptr._4_4_ = in_stack_fffffffffffffddc;
  elements_00._M_ptr._0_4_ = uVar4;
  elements_00._M_extent._M_extent_value = in_stack_fffffffffffffde0._M_extent_value;
  slang::syntax::SeparatedSyntaxList<slang::syntax::DefParamAssignmentSyntax>::SeparatedSyntaxList
            (this_00,elements_00);
  defparam_00.rawLen = in_stack_fffffffffffffddc;
  defparam_00.kind = (short)uVar4;
  defparam_00._2_1_ = (char)((uint)uVar4 >> 0x10);
  defparam_00.numFlags.raw = (char)((uint)uVar4 >> 0x18);
  defparam_00.info = (Info *)in_stack_fffffffffffffde0._M_extent_value;
  semi_00.info = pIVar5;
  semi_00.kind = (short)uVar2;
  semi_00._2_1_ = (char)((ulong)uVar2 >> 0x10);
  semi_00.numFlags.raw = (char)((ulong)uVar2 >> 0x18);
  semi_00.rawLen = (int)((ulong)uVar2 >> 0x20);
  pDVar3 = slang::syntax::SyntaxFactory::defParam
                     (pSStack_30,local_38,defparam_00,
                      (SeparatedSyntaxList<slang::syntax::DefParamAssignmentSyntax> *)0x8a9e3d,
                      semi_00);
  SmallVector<slang::syntax::TokenOrSyntax,_8UL>::~SmallVector
            ((SmallVector<slang::syntax::TokenOrSyntax,_8UL> *)0x8a9e51);
  return pDVar3;
}

Assistant:

DefParamSyntax& Parser::parseDefParam(AttrList attributes) {
    auto defparam = consume();

    Token semi;
    SmallVector<TokenOrSyntax, 8> buffer;
    parseList<isPossibleExpressionOrComma, isSemicolon>(
        buffer, TokenKind::Semicolon, TokenKind::Comma, semi, RequireItems::True,
        diag::ExpectedVariableAssignment, [this] { return &parseDefParamAssignment(); });

    meta.hasDefparams = true;
    return factory.defParam(attributes, defparam, buffer.copy(alloc), semi);
}